

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_object(Dispatch_Engine *this,Boxed_Value *o)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string *obj;
  Dispatch_Engine *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  bVar1 = Boxed_Value::is_const((Boxed_Value *)0x4469e2);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "const ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  obj = local_30;
  type_name_abi_cxx11_(in_stack_ffffffffffffffb8,(Boxed_Value *)obj);
  poVar2 = std::operator<<(poVar2,obj);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void dump_object(const Boxed_Value &o) const
        {
          std::cout << (o.is_const()?"const ":"") << type_name(o) << '\n';
        }